

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

Vertex * __thiscall Graph::findVertex(Graph *this,int id)

{
  int iVar1;
  Vertex *local_28;
  Vertex *v;
  int id_local;
  Graph *this_local;
  
  local_28 = this->verticesList;
  while( true ) {
    if (local_28 == (Vertex *)0x0) {
      return (Vertex *)0x0;
    }
    iVar1 = Vertex::getID(local_28);
    if (iVar1 == id) break;
    local_28 = Vertex::getNext(local_28);
  }
  return local_28;
}

Assistant:

Vertex *Graph::findVertex(int id){

    Vertex *v = verticesList;
    while(v!=NULL){
        if(v->getID() == id)
            return v;
        v = v->getNext();
    }
    return NULL;

}